

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O0

void __thiscall LazyARAPlanner::putStateInHeap(LazyARAPlanner *this,LazyARAState *state)

{
  CKey *NewKey;
  CHeap *in_RSI;
  long in_RDI;
  CKey key;
  CKey *in_stack_00000070;
  AbstractSearchState *in_stack_00000078;
  CHeap *in_stack_00000080;
  value_type *in_stack_ffffffffffffffa8;
  vector<LazyARAState_*,_std::allocator<LazyARAState_*>_> *in_stack_ffffffffffffffb0;
  CKey local_38;
  AbstractSearchState *in_stack_ffffffffffffffe8;
  
  if ((short)in_RSI[1].currentsize == *(short *)(in_RDI + 200)) {
    if ((in_RSI[2].currentsize & 1) == 0) {
      std::vector<LazyARAState_*,_std::allocator<LazyARAState_*>_>::push_back
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(undefined1 *)&in_RSI[2].currentsize = 1;
    }
  }
  else {
    CKey::CKey((CKey *)&stack0xffffffffffffffe0);
    NewKey = (CKey *)(ulong)(uint)(*(int *)&in_RSI[1].heap +
                                  (int)(*(double *)(in_RDI + 0xa8) *
                                       (double)*(int *)((long)&in_RSI[1].heap + 4)));
    if (in_RSI->currentsize == 0) {
      CHeap::insertheap(in_stack_00000080,in_stack_00000078,in_stack_00000070);
      CKey::~CKey((CKey *)&stack0xffffffffffffffa8);
    }
    else {
      local_38.key[0] = (long)NewKey;
      CHeap::updateheap(in_RSI,in_stack_ffffffffffffffe8,NewKey);
      CKey::~CKey(&local_38);
    }
    CKey::~CKey((CKey *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void LazyARAPlanner::putStateInHeap(LazyARAState* state)
{
    // we only allow one expansion per search iteration
    // so insert into heap if not closed yet
    if (state->iteration_closed != search_iteration) {
        SBPL_DEBUG("put state %d in open with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        CKey key;
        key.key[0] = state->g + int(eps * state->h);
        // if the state is already in the heap, just update its priority
        if (state->heapindex != 0) {
            heap.updateheap(state, key);
        }
        else { // otherwise add it to the heap
            heap.insertheap(state, key);
        }
    }
    // if the state has already been expanded once for this iteration then add
    // it to the incons list so we can keep track of states that we know we have
    // better costs for
    else if (!state->in_incons) {
        SBPL_DEBUG("put state %d in incons with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        incons.push_back(state);
        state->in_incons = true;
    }
}